

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proitems.h
# Opt level: O3

ProString * __thiscall
ProString::operator+=(ProString *this,QStringBuilder<const_char_(&)[2],_ProString> *other)

{
  ProString *pPVar1;
  long in_FS_OFFSET;
  QString local_30;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  QStringBuilder<const_char_(&)[2],_ProString>::convertTo<QString>(&local_30,other);
  pPVar1 = append(this,&local_30);
  if (&(local_30.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_30.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_30.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_30.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_30.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return pPVar1;
  }
  __stack_chk_fail();
}

Assistant:

ProString &operator+=(const QStringBuilder<A, B> &other) { return append(QString(other)); }